

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3IndexedByLookup(Parse *pParse,SrcItem *pFrom)

{
  byte bVar1;
  byte bVar2;
  Index *pIVar3;
  long lVar4;
  
  pIVar3 = pFrom->pSTab->pIndex;
joined_r0x001859c7:
  if (pIVar3 == (Index *)0x0) {
    sqlite3ErrorMsg(pParse,"no such index: %s",(pFrom->u1).zIndexedBy,0);
    pParse->checkSchema = '\x01';
    return 1;
  }
  lVar4 = 0;
  do {
    bVar1 = pIVar3->zName[lVar4];
    bVar2 = (pFrom->u1).zIndexedBy[lVar4];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) {
        (pFrom->u2).pIBIndex = pIVar3;
        return 0;
      }
    }
    else if (""[bVar1] != ""[bVar2]) break;
    lVar4 = lVar4 + 1;
  } while( true );
  pIVar3 = pIVar3->pNext;
  goto joined_r0x001859c7;
}

Assistant:

SQLITE_PRIVATE int sqlite3IndexedByLookup(Parse *pParse, SrcItem *pFrom){
  Table *pTab = pFrom->pSTab;
  char *zIndexedBy = pFrom->u1.zIndexedBy;
  Index *pIdx;
  assert( pTab!=0 );
  assert( pFrom->fg.isIndexedBy!=0 );

  for(pIdx=pTab->pIndex;
      pIdx && sqlite3StrICmp(pIdx->zName, zIndexedBy);
      pIdx=pIdx->pNext
  );
  if( !pIdx ){
    sqlite3ErrorMsg(pParse, "no such index: %s", zIndexedBy, 0);
    pParse->checkSchema = 1;
    return SQLITE_ERROR;
  }
  assert( pFrom->fg.isCte==0 );
  pFrom->u2.pIBIndex = pIdx;
  return SQLITE_OK;
}